

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Dfa::Nfa_to_Dfa(Dfa *this,Nfa *nfa)

{
  undefined1 uVar1;
  pointer pEVar2;
  pointer pNVar3;
  int iVar4;
  mapped_type_conflict *pmVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  iterator iVar8;
  _Rb_tree_node_base *p_Var9;
  Fa_Node *pFVar10;
  bool bVar11;
  int i_1;
  pointer ppFVar12;
  long lVar13;
  pointer pEVar14;
  long lVar15;
  char i;
  undefined3 uStack_ef;
  int local_ec;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *local_e8;
  Nfa *local_e0;
  long local_d8;
  Fa_Node *tp_Node;
  vector<Node_num,_std::allocator<Node_num>_> num;
  Node_num tp_num;
  map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_> trans;
  
  ppFVar12 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar12) {
    (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar12;
  }
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p =
       (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p;
  (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  ppFVar12 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar12) {
    (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar12;
  }
  local_e8 = &this->Node;
  ppFVar12 = (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar12) {
    (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppFVar12;
  }
  lVar13 = 1;
  local_e0 = nfa;
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::resize(local_e8,1);
  num.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  num.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  num.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  trans._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &trans._M_t._M_impl.super__Rb_tree_header._M_header;
  trans._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  trans._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  trans._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  trans._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       trans._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<Node_num,_std::allocator<Node_num>_>::resize(&num,1);
  tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header;
  tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (_i = 1; _i <= local_e0->n; _i = _i + 1) {
    if ((local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_start[_i]->start == true) {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&tp_num
                 ,(int *)&i);
    }
  }
  pmVar5 = std::
           map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
           ::operator[](&trans,&tp_num);
  *pmVar5 = 1;
  std::vector<Node_num,_std::allocator<Node_num>_>::push_back(&num,&tp_num);
  ppFVar12 = (local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar11 = false;
  for (p_Var6 = tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &tp_num.n._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    if (ppFVar12[(int)p_Var6[1]._M_color]->end != false) {
      bVar11 = true;
    }
  }
  tp_Node = (Fa_Node *)operator_new(0x28);
  (tp_Node->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (tp_Node->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (tp_Node->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tp_Node->n = 1;
  tp_Node->start = true;
  tp_Node->end = bVar11;
  tp_Node->temp = false;
  std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back(local_e8,&tp_Node);
  local_ec = 2;
  while (p_Var9 = all_char._M_t._M_impl.super__Rb_tree_header._M_header._M_left, lVar15 = lVar13,
        lVar13 < local_ec) {
    for (; local_d8 = lVar15,
        (_Rb_tree_header *)p_Var9 != &all_char._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      uVar1 = (undefined1)p_Var9[1]._M_color;
      _i = CONCAT31(uStack_ef,uVar1);
      if (uVar1 != _S_red) {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &tp_num);
        pNVar3 = num.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar13;
        for (p_Var7 = num.super__Vector_base<Node_num,_std::allocator<Node_num>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar13].n._M_t._M_impl.super__Rb_tree_header.
                      _M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &(pNVar3->n)._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
          pFVar10 = (local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[(int)p_Var7[1]._M_color];
          pEVar2 = *(pointer *)
                    ((long)&(pFVar10->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl
                    + 8);
          for (pEVar14 = (pFVar10->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                         super__Vector_impl_data._M_start; pEVar14 != pEVar2; pEVar14 = pEVar14 + 1)
          {
            if (pEVar14->c == i) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&tp_num,&pEVar14->v->n);
            }
          }
        }
        if (tp_num.n._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          iVar8 = std::
                  _Rb_tree<Node_num,_std::pair<const_Node_num,_int>,_std::_Select1st<std::pair<const_Node_num,_int>_>,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                  ::find(&trans._M_t,(key_type *)&tp_num);
          if ((_Rb_tree_header *)iVar8._M_node == &trans._M_t._M_impl.super__Rb_tree_header) {
            pmVar5 = std::
                     map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                     ::operator[](&trans,(key_type *)&tp_num);
            *pmVar5 = local_ec;
            std::vector<Node_num,_std::allocator<Node_num>_>::push_back(&num,(value_type *)&tp_num);
            ppFVar12 = (local_e0->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            bVar11 = false;
            for (p_Var6 = tp_num.n._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var6 != &tp_num.n._M_t._M_impl.super__Rb_tree_header;
                p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
              if (ppFVar12[(int)p_Var6[1]._M_color]->end != false) {
                bVar11 = true;
              }
            }
            tp_Node = (Fa_Node *)operator_new(0x28);
            (tp_Node->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (tp_Node->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (tp_Node->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            tp_Node->n = local_ec;
            tp_Node->start = false;
            tp_Node->end = bVar11;
            tp_Node->temp = false;
            std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back(local_e8,&tp_Node);
            std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                      ((vector<Edge,std::allocator<Edge>> *)
                       &(local_e8->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[local_d8]->edge,&tp_Node,&i);
            local_ec = local_ec + 1;
          }
          else {
            pFVar10 = (local_e8->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[local_d8];
            pmVar5 = std::
                     map<Node_num,_int,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
                     ::operator[](&trans,(key_type *)&tp_num);
            std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                      ((vector<Edge,std::allocator<Edge>> *)&pFVar10->edge,
                       (local_e8->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl
                       .super__Vector_impl_data._M_start + *pmVar5,&i);
          }
        }
      }
      lVar15 = local_d8;
    }
    lVar13 = local_d8 + 1;
  }
  iVar4 = local_ec + -1;
  this->n = iVar4;
  lVar15 = 8;
  for (lVar13 = 1; lVar13 <= iVar4; lVar13 = lVar13 + 1) {
    ppFVar12 = (local_e8->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
    pFVar10 = *(Fa_Node **)((long)ppFVar12 + lVar15);
    if (pFVar10->start == true) {
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back
                (&this->begin,(value_type *)((long)ppFVar12 + lVar15));
      ppFVar12 = (local_e8->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pFVar10 = ppFVar12[lVar13];
    }
    if (pFVar10->end == true) {
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back
                (&this->end,(value_type *)((long)ppFVar12 + lVar15));
    }
    iVar4 = this->n;
    lVar15 = lVar15 + 8;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &tp_num);
  std::
  _Rb_tree<Node_num,_std::pair<const_Node_num,_int>,_std::_Select1st<std::pair<const_Node_num,_int>_>,_std::less<Node_num>,_std::allocator<std::pair<const_Node_num,_int>_>_>
  ::~_Rb_tree(&trans._M_t);
  std::vector<Node_num,_std::allocator<Node_num>_>::~vector(&num);
  return;
}

Assistant:

void Dfa::Nfa_to_Dfa(Nfa &nfa) {//NFA -> DFA
    //DFA Node and used vector

    Node.clear();
    used.clear();
    begin.clear();
    end.clear();

    Node.resize(1);

    vector<Node_num> num;
    map<Node_num, int> trans;
    //DFA Node num trans to NFA Node num

    num.resize(1);

    int tot = 1;
    int now = 1;

    Node_num tp_num;
    Fa_Node *tp_Node;
    bool strat_flag = false, end_flag = false;

    //find start Node
    for (int i = 1; i <= nfa.n; i++) {
        if (nfa.Node[i]->start) {
            tp_num.n.insert(i);
        }
    }

    //insert start Node
    trans[tp_num] = tot;
    num.push_back(tp_num);
    strat_flag = false, end_flag = false;
    for (auto i:tp_num.n) {
        if (nfa.Node[i]->end) {
            end_flag = true;
        }
    }
    strat_flag = true;
    tp_Node = new Fa_Node(tot, strat_flag, end_flag);
    Node.push_back(tp_Node);

    tot++;
    while (now < tot) {
        for (auto i:all_char) {// char
            if (i == '\0') {
                continue;
            }
            tp_num.n.clear();
            for (auto j:num[now].n) {// NFA Node num
                for (auto k:nfa.Node[j]->edge) {//Node edge
                    if (k.c == i) {
                        tp_num.n.insert(k.v->n);
                        continue;
                    }
                }
            }
            if (tp_num.n.empty()) {// edge does not exist
                continue;
            }
            if (trans.find(tp_num) != trans.end()) {// Node has been created
                Node[now]->edge.emplace_back(Node[trans[tp_num]], i);
            } else {// creat Node
                trans[tp_num] = tot;
                num.push_back(tp_num);
                strat_flag = false, end_flag = false;
                for (auto j:tp_num.n) {
                    if (nfa.Node[j]->end) {
                        end_flag = true;
                    }
                }
                tp_Node = new Fa_Node(tot, strat_flag, end_flag);
                Node.push_back(tp_Node);

                Node[now]->edge.emplace_back(tp_Node, i);
                tot++;
            }
        }
        now++;
    }

    //update n  begin   end
    n = tot - 1;
    for (int i = 1; i <= n; i++) {
        if (Node[i]->start) {
            begin.push_back(Node[i]);
        }
        if (Node[i]->end) {
            end.push_back(Node[i]);
        }
    }
}